

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi64 HashmapCount(jx9_hashmap *pMap,int bRecursive,int iRecCount)

{
  uint uVar1;
  jx9_hashmap_node *pjVar2;
  jx9_vm *pjVar3;
  void *pvVar4;
  ulong uVar5;
  sxi64 sVar6;
  long lVar7;
  ulong uVar8;
  jx9_hashmap_node **ppjVar9;
  uint uVar10;
  bool bVar11;
  
  if (bRecursive == 0) {
    uVar8 = (ulong)pMap->nEntry;
  }
  else {
    ppjVar9 = &pMap->pLast;
    uVar10 = pMap->nEntry;
    uVar8 = (ulong)uVar10;
    lVar7 = 0;
    while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
      pjVar2 = *ppjVar9;
      pjVar3 = pMap->pVm;
      uVar1 = pjVar2->nValIdx;
      if (((uVar1 < (pjVar3->aMemObj).nUsed) &&
          (pvVar4 = (pjVar3->aMemObj).pBase, pvVar4 != (void *)0x0)) &&
         (uVar5 = (ulong)(uVar1 * (pjVar3->aMemObj).eSize),
         (*(byte *)((long)pvVar4 + uVar5 + 8) & 0x40) != 0)) {
        if (0x1f < iRecCount) {
          return lVar7;
        }
        sVar6 = HashmapCount(*(jx9_hashmap **)((long)pvVar4 + uVar5),1,iRecCount + 1);
        lVar7 = lVar7 + sVar6;
      }
      ppjVar9 = &pjVar2->pNext;
    }
    uVar8 = lVar7 + uVar8;
  }
  return uVar8;
}

Assistant:

static sxi64 HashmapCount(jx9_hashmap *pMap, int bRecursive, int iRecCount)
{
	sxi64 iCount = 0;
	if( !bRecursive ){
		iCount = pMap->nEntry;
	}else{
		/* Recursive hashmap walk */
		jx9_hashmap_node *pEntry = pMap->pLast;
		jx9_value *pElem;
		sxu32 n = 0;
		for(;;){
			if( n >= pMap->nEntry ){
				break;
			}
			/* Point to the element value */
			pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pEntry->nValIdx);
			if( pElem ){
				if( pElem->iFlags & MEMOBJ_HASHMAP ){
					if( iRecCount > 31 ){
						/* Nesting limit reached */
						return iCount;
					}
					/* Recurse */
					iRecCount++;
					iCount += HashmapCount((jx9_hashmap *)pElem->x.pOther, TRUE, iRecCount);
					iRecCount--;
				}
			}
			/* Point to the next entry */
			pEntry = pEntry->pNext;
			++n;
		}
		/* Update count */
		iCount += pMap->nEntry;
	}
	return iCount;
}